

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseAttribute(xmlParserCtxtPtr ctxt,xmlChar **value)

{
  xmlParserInputPtr pxVar1;
  int iVar2;
  xmlChar *str1;
  xmlChar *lang;
  xmlParserErrors code;
  char *msg;
  char *pcVar3;
  
  *value = (xmlChar *)0x0;
  pxVar1 = ctxt->input;
  if (((pxVar1->flags & 0x40) == 0) && ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  str1 = xmlParseName(ctxt);
  if (str1 == (xmlChar *)0x0) {
    pcVar3 = "error parsing attribute name\n";
    msg = "%s";
    code = XML_ERR_NAME_REQUIRED;
    str1 = (xmlChar *)0x0;
  }
  else {
    xmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur == '=') {
      xmlNextChar(ctxt);
      xmlSkipBlankChars(ctxt);
      if ((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->input == (xmlParserInputPtr)0x0)) {
        lang = (xmlChar *)0x0;
      }
      else {
        lang = xmlParseAttValueInternal(ctxt,(int *)0x0,(int *)0x0,0,0);
      }
      if (((ctxt->pedantic != 0) && (iVar2 = xmlStrEqual(str1,(xmlChar *)"xml:lang"), iVar2 != 0))
         && (iVar2 = xmlCheckLanguageID(lang), iVar2 == 0)) {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_WAR_LANG_VALUE,XML_ERR_WARNING,lang,
                   (xmlChar *)0x0,(xmlChar *)0x0,0,"Malformed value for xml:lang : %s\n",lang,0);
      }
      iVar2 = xmlStrEqual(str1,(xmlChar *)"xml:space");
      if (iVar2 != 0) {
        iVar2 = xmlStrEqual(lang,"default");
        if (iVar2 == 0) {
          iVar2 = xmlStrEqual(lang,(xmlChar *)"preserve");
          if (iVar2 == 0) {
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_WAR_SPACE_VALUE,XML_ERR_WARNING,lang
                       ,(xmlChar *)0x0,(xmlChar *)0x0,0,
                       "Invalid value \"%s\" for xml:space : \"default\" or \"preserve\" expected\n"
                       ,lang,0);
          }
          else {
            *ctxt->space = 1;
          }
        }
        else {
          *ctxt->space = 0;
        }
      }
      *value = lang;
      return str1;
    }
    msg = "Specification mandates value for attribute %s\n";
    code = XML_ERR_ATTRIBUTE_WITHOUT_VALUE;
    pcVar3 = (char *)str1;
  }
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,str1,(xmlChar *)0x0,
             (xmlChar *)0x0,0,msg,pcVar3);
  return str1;
}

Assistant:

const xmlChar *
xmlParseAttribute(xmlParserCtxtPtr ctxt, xmlChar **value) {
    const xmlChar *name;
    xmlChar *val;

    *value = NULL;
    GROW;
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	               "error parsing attribute name\n");
        return(NULL);
    }

    /*
     * read the value
     */
    SKIP_BLANKS;
    if (RAW == '=') {
        NEXT;
	SKIP_BLANKS;
	val = xmlParseAttValue(ctxt);
    } else {
	xmlFatalErrMsgStr(ctxt, XML_ERR_ATTRIBUTE_WITHOUT_VALUE,
	       "Specification mandates value for attribute %s\n", name);
	return(name);
    }

    /*
     * Check that xml:lang conforms to the specification
     * No more registered as an error, just generate a warning now
     * since this was deprecated in XML second edition
     */
    if ((ctxt->pedantic) && (xmlStrEqual(name, BAD_CAST "xml:lang"))) {
	if (!xmlCheckLanguageID(val)) {
	    xmlWarningMsg(ctxt, XML_WAR_LANG_VALUE,
		          "Malformed value for xml:lang : %s\n",
			  val, NULL);
	}
    }

    /*
     * Check that xml:space conforms to the specification
     */
    if (xmlStrEqual(name, BAD_CAST "xml:space")) {
	if (xmlStrEqual(val, BAD_CAST "default"))
	    *(ctxt->space) = 0;
	else if (xmlStrEqual(val, BAD_CAST "preserve"))
	    *(ctxt->space) = 1;
	else {
		xmlWarningMsg(ctxt, XML_WAR_SPACE_VALUE,
"Invalid value \"%s\" for xml:space : \"default\" or \"preserve\" expected\n",
                                 val, NULL);
	}
    }

    *value = val;
    return(name);
}